

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icon.cpp
# Opt level: O2

void __thiscall setup::icon_entry::load(icon_entry *this,istream *is,info *i)

{
  bitset<256UL> *pbVar1;
  istream **this_00;
  byte bVar2;
  uint16_t uVar3;
  unsigned_short uVar4;
  int iVar5;
  uint uVar6;
  close_setting cVar7;
  logger *plVar8;
  flag_type fVar9;
  uint uVar10;
  stored_flag_reader<flags<setup::icon_entry::flags_Enum_,_8UL>_> flagreader;
  
  if ((i->version).value < 0x1030000) {
    util::load<int,util::little_endian>(is);
  }
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.pad_bits = (size_t)&this->name
  ;
  pbVar1 = &(i->header).lead_bytes;
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.stream =
       (istream *)
       CONCAT44(flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.stream._4_4_,
                i->codepage);
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.pos = (size_t)pbVar1;
  util::operator>>(is,(encoded_string *)&flagreader);
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.pad_bits =
       (size_t)&this->filename;
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.stream =
       (istream *)
       CONCAT44(flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.stream._4_4_,
                i->codepage);
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.pos = (size_t)pbVar1;
  util::operator>>(is,(encoded_string *)&flagreader);
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.pad_bits =
       (size_t)&this->parameters;
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.stream =
       (istream *)
       CONCAT44(flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.stream._4_4_,
                i->codepage);
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.pos = (size_t)pbVar1;
  util::operator>>(is,(encoded_string *)&flagreader);
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.pad_bits =
       (size_t)&this->working_dir;
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.stream =
       (istream *)
       CONCAT44(flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.stream._4_4_,
                i->codepage);
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.pos = (size_t)pbVar1;
  util::operator>>(is,(encoded_string *)&flagreader);
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.pad_bits =
       (size_t)&this->icon_file;
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.stream =
       (istream *)
       CONCAT44(flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.stream._4_4_,
                i->codepage);
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.pos = (size_t)pbVar1;
  util::operator>>(is,(encoded_string *)&flagreader);
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.pad_bits =
       (size_t)&this->comment;
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.stream =
       (istream *)
       CONCAT44(flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.stream._4_4_,
                i->codepage);
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.pos = 0;
  util::operator>>(is,(encoded_string *)&flagreader);
  item::load_condition_data(&this->super_item,is,i);
  if ((i->version).value < 0x5030500) {
    (this->app_user_model_id)._M_string_length = 0;
    *(this->app_user_model_id)._M_dataplus._M_p = '\0';
  }
  else {
    flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.pad_bits =
         (size_t)&this->app_user_model_id;
    flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.stream =
         (istream *)
         CONCAT44(flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.stream._4_4_,
                  i->codepage);
    flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.pos = 0;
    util::operator>>(is,(encoded_string *)&flagreader);
  }
  if ((i->version).value < 0x6010000) {
    (this->app_user_model_toast_activator_clsid)._M_string_length = 0;
    *(this->app_user_model_toast_activator_clsid)._M_dataplus._M_p = '\0';
  }
  else {
    std::__cxx11::string::resize((ulong)&this->app_user_model_toast_activator_clsid);
    std::istream::read((char *)is,
                       (long)(this->app_user_model_toast_activator_clsid)._M_dataplus._M_p);
  }
  windows_version_range::load(&(this->super_item).winver,is,&i->version);
  uVar3 = version::bits(&i->version);
  iVar5 = util::load<int,util::little_endian>(is,(ulong)uVar3);
  this->icon_index = iVar5;
  uVar10 = (i->version).value;
  if (uVar10 < 0x1031800) {
    uVar6 = 1;
  }
  else {
    uVar6 = util::load<int,util::little_endian>(is);
    uVar10 = (i->version).value;
  }
  this->show_command = uVar6;
  if (uVar10 < 0x1030f00) {
    this->close_on_exit = NoSetting;
LAB_00133aad:
    uVar4 = 0;
  }
  else {
    bVar2 = util::load<unsigned_char,util::little_endian>(is);
    if (bVar2 < 3) {
      cVar7 = *(close_setting *)
               ((anonymous_namespace)::stored_close_setting::values + (ulong)bVar2 * 4);
    }
    else {
      this_00 = &flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.stream;
      flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.pad_bits =
           CONCAT44(flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.pad_bits.
                    _4_4_,2);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      std::operator<<((ostream *)this_00,"Unexpected ");
      plVar8 = logger::operator<<((logger *)&flagreader,
                                  &enum_names<setup::icon_entry::close_setting>::name);
      std::operator<<((ostream *)&plVar8->buffer," value: ");
      std::ostream::_M_insert<unsigned_long>((ulong)&plVar8->buffer);
      logger::~logger((logger *)&flagreader);
      cVar7 = NoSetting;
    }
    this->close_on_exit = cVar7;
    if ((i->version).value < 0x2000700) goto LAB_00133aad;
    uVar4 = util::load<short,util::little_endian>(is);
  }
  this->hotkey = uVar4;
  uVar3 = version::bits(&i->version);
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.pad_bits = (size_t)uVar3;
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.pos = 0;
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.buffer = '\0';
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.result._flags.
  super__Base_bitset<1UL>._M_w = (Type)(_Base_bitset<1UL>)0x0;
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.bytes = 0;
  flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>.stream = is;
  stored_flag_reader<setup::icon_entry::flags_Enum_>::add
            (&flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>,NeverUninstall);
  if ((i->version).value < 0x1031a00) {
    stored_flag_reader<setup::icon_entry::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>,RunMinimized);
  }
  stored_flag_reader<setup::icon_entry::flags_Enum_>::add
            (&flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>,
             CreateOnlyIfFileExists);
  uVar3 = version::bits(&i->version);
  if (uVar3 != 0x10) {
    stored_flag_reader<setup::icon_entry::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>,UseAppPaths);
  }
  uVar10 = (i->version).value;
  if (0x50002ff < uVar10) {
    if (uVar10 < 0x6030000) {
      stored_flag_reader<setup::icon_entry::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>,FolderShortcut
                );
      if ((i->version).value < 0x5040200) goto LAB_00133b72;
    }
    stored_flag_reader<setup::icon_entry::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>,
               ExcludeFromShowInNewInstall);
    if (0x504ffff < (i->version).value) {
      stored_flag_reader<setup::icon_entry::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>,PreventPinning
                );
      if (0x600ffff < (i->version).value) {
        stored_flag_reader<setup::icon_entry::flags_Enum_>::add
                  (&flagreader.super_stored_flag_reader<setup::icon_entry::flags_Enum_>,
                   HasAppUserModelToastActivatorCLSID);
      }
    }
  }
LAB_00133b72:
  fVar9 = stored_flag_reader<setup::data_entry::flags_Enum_>::finalize
                    ((stored_flag_reader<setup::data_entry::flags_Enum_> *)&flagreader);
  (this->options)._flags.super__Base_bitset<1UL>._M_w =
       (_WordT)fVar9._flags.super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

void icon_entry::load(std::istream & is, const info & i) {
	
	if(i.version < INNO_VERSION(1, 3, 0)) {
		(void)util::load<boost::uint32_t>(is); // uncompressed size of the entry
	}
	
	is >> util::encoded_string(name, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(filename, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(parameters, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(working_dir, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(icon_file, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(comment, i.codepage);
	
	load_condition_data(is, i);
	
	if(i.version >= INNO_VERSION(5, 3, 5)) {
		is >> util::encoded_string(app_user_model_id, i.codepage);
	} else {
		app_user_model_id.clear();
	}
	
	if(i.version >= INNO_VERSION(6, 1, 0)) {
		const size_t guid_size = 16;
		app_user_model_toast_activator_clsid.resize(guid_size);
		is.read(&app_user_model_toast_activator_clsid[0], std::streamsize(guid_size));
	} else {
		app_user_model_toast_activator_clsid.clear();
	}
	
	load_version_data(is, i.version);
	
	icon_index = util::load<boost::int32_t>(is, i.version.bits());
	
	if(i.version >= INNO_VERSION(1, 3, 24)) {
		show_command = util::load<boost::int32_t>(is);
	} else {
		show_command = 1;
	}
	if(i.version >= INNO_VERSION(1, 3, 15)) {
		close_on_exit = stored_enum<stored_close_setting>(is).get();
	} else {
		close_on_exit = NoSetting;
	}
	
	if(i.version >= INNO_VERSION(2, 0, 7)) {
		hotkey = util::load<boost::uint16_t>(is);
	} else {
		hotkey = 0;
	}
	
	stored_flag_reader<flags> flagreader(is, i.version.bits());
	
	flagreader.add(NeverUninstall);
	if(i.version < INNO_VERSION(1, 3, 26)) {
		flagreader.add(RunMinimized);
	}
	flagreader.add(CreateOnlyIfFileExists);
	if(i.version.bits() != 16) {
		flagreader.add(UseAppPaths);
	}
	if(i.version >= INNO_VERSION(5, 0, 3) && i.version < INNO_VERSION(6, 3, 0)) {
		flagreader.add(FolderShortcut);
	}
	if(i.version >= INNO_VERSION(5, 4, 2)) {
		flagreader.add(ExcludeFromShowInNewInstall);
	}
	if(i.version >= INNO_VERSION(5, 5, 0)) {
		flagreader.add(PreventPinning);
	}
	if(i.version >= INNO_VERSION(6, 1, 0)) {
		flagreader.add(HasAppUserModelToastActivatorCLSID);
	}
	
	options = flagreader.finalize();
}